

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_row_access_constructors<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>>>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>
                *matrix,map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>_>_>_>
                        *rows)

{
  Column_support *this_node;
  ID_index IVar1;
  pointer pIVar2;
  node_ptr plVar3;
  node_ptr *pplVar4;
  Index IVar5;
  Chain_column_option CVar6;
  bool bVar7;
  node_ptr to_insert;
  Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
  *__v;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>>
  *this;
  long lVar8;
  _Base_ptr p_Var9;
  const_node_ptr p;
  Column_support *pCVar10;
  Column_support *pCVar11;
  node_ptr plVar12;
  long *plVar13;
  undefined4 local_2ac;
  undefined *local_2a8;
  undefined4 *local_2a0;
  undefined **local_298;
  undefined **local_290;
  char *local_288;
  shared_count sStack_280;
  char *local_278;
  undefined **local_270;
  ulong local_268;
  shared_count sStack_260;
  undefined4 **local_258;
  Delete_disposer local_250;
  undefined1 local_248;
  undefined8 *local_240;
  undefined ***local_238;
  char *local_230;
  char *local_228;
  shared_count sStack_220;
  _Base_ptr local_218;
  undefined4 **local_210;
  char *local_208;
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
  col;
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
  moveCol;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&col,(vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&col);
  build_column_values<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&col,(vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&col);
  pIVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  col.super_Row_access_option.columnIndex_ = 6;
  col.super_Column_dimension_option.dim_ = (pIVar2->super_Column_dimension_option).dim_;
  col.super_Chain_column_option = pIVar2->super_Chain_column_option;
  col.operators_ = pIVar2->operators_;
  col.entryPool_ = pIVar2->entryPool_;
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)&col.column_;
  plVar13 = *(long **)&(pIVar2->column_).super_type.data_.root_plus_size_;
  col.super_Row_access_option.rows_ = rows;
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
       col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  if ((Column_support *)plVar13 != &pIVar2->column_) {
    do {
      IVar1 = *(ID_index *)(plVar13 + 2);
      __v = (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
             *)operator_new(0x20);
      (__v->super_Entry_column_index_option).columnIndex_ = col.super_Row_access_option.columnIndex_
      ;
      (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
      (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
      __v->rowIndex_ = IVar1;
      (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
           col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
      (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
           (node_ptr)&col.column_;
      pplVar4 = &(col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_)->next_;
      col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
           (node_ptr)&__v->super_Column_hook;
      *pplVar4 = (node_ptr)&__v->super_Column_hook;
      moveCol.super_Row_access_option.columnIndex_ = IVar1;
      if (col.super_Row_access_option.rows_ != (Row_container *)0x0) {
        this = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>>
                *)std::
                  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>_>_>_>
                  ::operator[](col.super_Row_access_option.rows_,(key_type *)&moveCol);
        std::
        _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>>
        ::
        _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>const&>
                  (this,__v);
      }
      plVar13 = (long *)*plVar13;
    } while ((Column_support *)plVar13 != &pIVar2->column_);
  }
  p_Var9 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_218 = &(rows->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var9 != local_218) {
    do {
      if (p_Var9[2]._M_left != (_Base_ptr)0x0) {
        lVar8 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var9[1]._M_left);
        if ((*(uint *)(lVar8 + 0x38) < 6) && ((0x2bU >> (*(uint *)(lVar8 + 0x38) & 0x1f) & 1) != 0))
        {
          local_120 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_118 = "";
          local_130 = &boost::unit_test::basic_cstring<char_const>::null;
          local_128 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x20d,
                     &local_130);
          local_268 = local_268 & 0xffffffffffffff00;
          local_270 = &PTR__lazy_ostream_001de440;
          sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_258 = (undefined4 **)0x1a9184;
          local_2a0 = (undefined4 *)CONCAT44(local_2a0._4_4_,*(int *)(lVar8 + 0x20));
          local_2a8 = (undefined *)CONCAT44(local_2a8._4_4_,6);
          local_290 = (undefined **)CONCAT71(local_290._1_7_,*(int *)(lVar8 + 0x20) == 6);
          local_288 = (char *)0x0;
          sStack_280.pi_ = (sp_counted_base *)0x0;
          local_230 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_228 = "";
          local_210 = &local_2a0;
          moveCol.super_Row_access_option.rows_ =
               (Row_container *)((ulong)moveCol.super_Row_access_option.rows_ & 0xffffffffffffff00);
          moveCol.super_Row_access_option._0_8_ = &PTR__lazy_ostream_001de900;
          moveCol.super_Column_dimension_option.dim_ = 0x1e6118;
          moveCol.super_Chain_column_option.pivot_ = 0;
          moveCol._24_8_ = &local_210;
          local_298 = &local_2a8;
          local_248 = 0;
          local_250.col_ =
               (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
                *)&PTR__lazy_ostream_001de940;
          local_240 = &boost::unit_test::lazy_ostream::inst;
          local_238 = &local_298;
          boost::test_tools::tt_detail::report_assertion
                    (&local_290,&local_270,&local_230,0x20d,1,2,2,"entry.get_column_index()",
                     &moveCol,"6",&local_250);
          boost::detail::shared_count::~shared_count(&sStack_280);
        }
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_218);
  }
  moveCol.entryPool_ = col.entryPool_;
  moveCol.operators_ = col.operators_;
  CVar6 = col.super_Chain_column_option;
  moveCol.super_Column_dimension_option.dim_ = col.super_Column_dimension_option.dim_;
  IVar5 = col.super_Row_access_option.columnIndex_;
  col.super_Row_access_option.columnIndex_ = 0;
  this_node = &moveCol.column_;
  moveCol.super_Row_access_option.columnIndex_ = IVar5;
  moveCol.super_Row_access_option.rows_ = col.super_Row_access_option.rows_;
  col.super_Column_dimension_option.dim_ = -1;
  col.super_Chain_column_option.pivot_ = 0xffffffff;
  col.super_Chain_column_option.pairedColumn_ = 0xffffffff;
  moveCol.super_Chain_column_option.pivot_ = CVar6.pivot_;
  moveCol.super_Chain_column_option.pairedColumn_ = CVar6.pairedColumn_;
  col.operators_ = (Field_operators *)0x0;
  col.entryPool_ = (Entry_constructor *)0x0;
  pCVar11 = &col.column_;
  moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)this_node;
  moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)this_node;
  boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
  swap_nodes((node_ptr)this_node,(node_ptr)pCVar11);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
  local_290 = &PTR__lazy_ostream_001de440;
  sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a8 = (undefined *)0xffffffffffffffff;
  pCVar10 = this_node;
  do {
    pCVar10 = (Column_support *)
              (pCVar10->super_type).data_.root_plus_size_.m_header.super_node.next_;
    local_2a8 = local_2a8 + 1;
  } while (pCVar10 != this_node);
  local_298 = &local_2a8;
  local_2a0 = &local_2ac;
  local_2ac = 4;
  local_228 = (char *)0x0;
  sStack_220.pi_ = (sp_counted_base *)0x0;
  local_210 = (undefined4 **)0x1a9c54;
  local_208 = "";
  local_238 = &local_298;
  local_248 = 0;
  local_250.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001de400;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_258 = &local_2a0;
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_001de940;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_230._0_1_ = local_2a8 == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,&local_290,&local_210,0x21c,1,2,2,"moveCol.size()",&local_250,"4",&local_270
            );
  boost::detail::shared_count::~shared_count(&sStack_220);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
  local_290 = &PTR__lazy_ostream_001de440;
  sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  lVar8 = 1;
  pCVar10 = pCVar11;
  do {
    pCVar10 = (Column_support *)
              (pCVar10->super_type).data_.root_plus_size_.m_header.super_node.next_;
    lVar8 = lVar8 + -1;
  } while (pCVar10 != pCVar11);
  local_2a8 = (undefined *)-lVar8;
  local_2ac = 0;
  local_230 = (char *)CONCAT71(local_230._1_7_,lVar8 == 0);
  local_228 = (char *)0x0;
  sStack_220.pi_ = (sp_counted_base *)0x0;
  local_210 = (undefined4 **)0x1a9c54;
  local_208 = "";
  local_298 = &local_2a8;
  local_248 = 0;
  local_250.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001de400;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_238 = &local_298;
  local_2a0 = &local_2ac;
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_001de940;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = &local_2a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,&local_290,&local_210,0x21d,1,2,2,"col.size()",&local_250,"0",&local_270);
  boost::detail::shared_count::~shared_count(&sStack_220);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar7 = Gudhi::persistence_matrix::operator==
                    ((matrix->
                     super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,&moveCol);
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar7);
  local_268 = 0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_290 = (undefined **)0x1b3d2a;
  local_288 = "";
  local_248 = 0;
  local_250.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001de388;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_238 = &local_290;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_260);
  p_Var9 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var9 != local_218) {
    do {
      if (p_Var9[2]._M_left != (_Base_ptr)0x0) {
        lVar8 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var9[1]._M_left);
        if ((*(uint *)(lVar8 + 0x38) < 6) && ((0x2bU >> (*(uint *)(lVar8 + 0x38) & 0x1f) & 1) != 0))
        {
          local_140 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_138 = "";
          local_150 = &boost::unit_test::basic_cstring<char_const>::null;
          local_148 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x225,
                     &local_150);
          local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
          local_290 = &PTR__lazy_ostream_001de440;
          sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_278 = "";
          local_2a8 = (undefined *)CONCAT44(local_2a8._4_4_,*(int *)(lVar8 + 0x20));
          local_2ac = 6;
          local_230 = (char *)CONCAT71(local_230._1_7_,*(int *)(lVar8 + 0x20) == 6);
          local_228 = (char *)0x0;
          sStack_220.pi_ = (sp_counted_base *)0x0;
          local_210 = (undefined4 **)0x1a9c54;
          local_208 = "";
          local_298 = &local_2a8;
          local_248 = 0;
          local_250.col_ =
               (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
                *)&PTR__lazy_ostream_001de900;
          local_240 = &boost::unit_test::lazy_ostream::inst;
          local_238 = &local_298;
          local_2a0 = &local_2ac;
          local_268 = local_268 & 0xffffffffffffff00;
          local_270 = &PTR__lazy_ostream_001de940;
          sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_258 = &local_2a0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_230,&local_290,&local_210,0x225,1,2,2,"entry.get_column_index()",
                     &local_250,"6",&local_270);
          boost::detail::shared_count::~shared_count(&sStack_220);
        }
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_218);
  }
  Gudhi::persistence_matrix::swap(&col,&moveCol);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
  local_290 = &PTR__lazy_ostream_001de440;
  sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  lVar8 = 1;
  pCVar11 = this_node;
  do {
    pCVar11 = (Column_support *)
              (pCVar11->super_type).data_.root_plus_size_.m_header.super_node.next_;
    lVar8 = lVar8 + -1;
  } while (pCVar11 != this_node);
  local_2a8 = (undefined *)-lVar8;
  local_2ac = 0;
  local_228 = (char *)0x0;
  sStack_220.pi_ = (sp_counted_base *)0x0;
  local_210 = (undefined4 **)0x1a9c54;
  local_208 = "";
  local_298 = &local_2a8;
  local_248 = 0;
  local_250.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001de400;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_238 = &local_298;
  local_2a0 = &local_2ac;
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_001de940;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = &local_2a0;
  local_230._0_1_ = lVar8 == 0;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,&local_290,&local_210,0x234,1,2,2,"moveCol.size()",&local_250,"0",&local_270
            );
  boost::detail::shared_count::~shared_count(&sStack_220);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
  local_290 = &PTR__lazy_ostream_001de440;
  sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a8 = (undefined *)0xffffffffffffffff;
  plVar12 = (node_ptr)&col.column_;
  do {
    plVar12 = (((type *)&plVar12->next_)->data_).root_plus_size_.m_header.super_node.next_;
    local_2a8 = local_2a8 + 1;
  } while (plVar12 != (node_ptr)&col.column_);
  local_2ac = 4;
  local_230 = (char *)CONCAT71(local_230._1_7_,local_2a8 == (undefined *)0x4);
  local_228 = (char *)0x0;
  sStack_220.pi_ = (sp_counted_base *)0x0;
  local_210 = (undefined4 **)0x1a9c54;
  local_208 = "";
  local_298 = &local_2a8;
  local_248 = 0;
  local_250.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001de400;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_238 = &local_298;
  local_2a0 = &local_2ac;
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_001de940;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = &local_2a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,&local_290,&local_210,0x235,1,2,2,"col.size()",&local_250,"4",&local_270);
  boost::detail::shared_count::~shared_count(&sStack_220);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar7 = Gudhi::persistence_matrix::operator==
                    ((matrix->
                     super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,&col);
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar7);
  local_268 = 0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_290 = (undefined **)0x1b3d3f;
  local_288 = "";
  local_248 = 0;
  local_250.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001de388;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_238 = &local_290;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_260);
  p_Var9 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var9 != local_218) {
    do {
      if (p_Var9[2]._M_left != (_Base_ptr)0x0) {
        lVar8 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var9[1]._M_left);
        if ((*(uint *)(lVar8 + 0x38) < 6) && ((0x2bU >> (*(uint *)(lVar8 + 0x38) & 0x1f) & 1) != 0))
        {
          local_160 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_158 = "";
          local_170 = &boost::unit_test::basic_cstring<char_const>::null;
          local_168 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x23d,
                     &local_170);
          local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
          local_290 = &PTR__lazy_ostream_001de440;
          sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_278 = "";
          local_2a8 = (undefined *)CONCAT44(local_2a8._4_4_,*(int *)(lVar8 + 0x20));
          local_2ac = 6;
          local_230 = (char *)CONCAT71(local_230._1_7_,*(int *)(lVar8 + 0x20) == 6);
          local_228 = (char *)0x0;
          sStack_220.pi_ = (sp_counted_base *)0x0;
          local_210 = (undefined4 **)0x1a9c54;
          local_208 = "";
          local_298 = &local_2a8;
          local_248 = 0;
          local_250.col_ =
               (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
                *)&PTR__lazy_ostream_001de900;
          local_240 = &boost::unit_test::lazy_ostream::inst;
          local_238 = &local_298;
          local_2a0 = &local_2ac;
          local_268 = local_268 & 0xffffffffffffff00;
          local_270 = &PTR__lazy_ostream_001de940;
          sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_258 = &local_2a0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_230,&local_290,&local_210,0x23d,1,2,2,"entry.get_column_index()",
                     &local_250,"6",&local_270);
          boost::detail::shared_count::~shared_count(&sStack_220);
        }
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_218);
  }
  local_250.col_ = &moveCol;
  if (moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ !=
      (node_ptr)this_node) {
    plVar12 = moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
    do {
      plVar3 = plVar12->next_;
      plVar12->next_ = (node_ptr)0x0;
      plVar12->prev_ = (node_ptr)0x0;
      Gudhi::persistence_matrix::
      Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
      ::Delete_disposer::operator()(&local_250,(Entry *)&plVar12[-1].prev_);
      plVar12 = plVar3;
    } while (plVar3 != (node_ptr)this_node);
  }
  moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  moveCol.super_Row_access_option._0_8_ = &col;
  if (col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ !=
      (node_ptr)&col.column_) {
    plVar12 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
    do {
      plVar3 = plVar12->next_;
      plVar12->next_ = (node_ptr)0x0;
      plVar12->prev_ = (node_ptr)0x0;
      Gudhi::persistence_matrix::
      Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
      ::Delete_disposer::operator()((Delete_disposer *)&moveCol,(Entry *)&plVar12[-1].prev_);
      plVar12 = plVar3;
    } while (plVar3 != (node_ptr)&col.column_);
  }
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}